

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O0

void yyTraceShift(yyParser_conflict *yypParser,int yyNewState)

{
  int yyNewState_local;
  yyParser_conflict *yypParser_local;
  
  if (yyTraceFILE != (FILE *)0x0) {
    if (yyNewState < 0xf5) {
      fprintf((FILE *)yyTraceFILE,"%sShift \'%s\', go to state %d\n",yyTracePrompt,
              yyTokenName[yypParser->yystack[yypParser->yyidx].major],(ulong)(uint)yyNewState);
    }
    else {
      fprintf((FILE *)yyTraceFILE,"%sShift \'%s\'\n",yyTracePrompt,
              yyTokenName[yypParser->yystack[yypParser->yyidx].major]);
    }
  }
  return;
}

Assistant:

static void yyTraceShift(yyParser *yypParser, int yyNewState){
  if( yyTraceFILE ){
    if( yyNewState<YYNSTATE ){
      fprintf(yyTraceFILE,"%sShift '%s', go to state %d\n",
         yyTracePrompt,yyTokenName[yypParser->yystack[yypParser->yyidx].major],
         yyNewState);
    }else{
      fprintf(yyTraceFILE,"%sShift '%s'\n",
         yyTracePrompt,yyTokenName[yypParser->yystack[yypParser->yyidx].major]);
    }
  }
}